

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_sa_system.hpp
# Opt level: O1

void __thiscall
openjij::test::System_BinaryPolynomialSystemExplicitLinearQuad_Test::
~System_BinaryPolynomialSystemExplicitLinearQuad_Test
          (System_BinaryPolynomialSystemExplicitLinearQuad_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(System, BinaryPolynomialSystemExplicitLinearQuad) {
   using BPM = graph::BinaryPolynomialModel<double>;
         
   const std::vector<std::vector<typename BPM::IndexType>> key_list = {
      {1, 1},
      {2, 2},
      {3, 3},
      {1, 2},
      {1, 3},
      {2, 3}
   };
      
   const std::vector<double> value_list = {
      +1.0,
      +2.0,
      +3.0,
      +3.0,
      -1.0,
      -1.5
   };
   
   const auto bpm = BPM{key_list, value_list};
   auto sa_system = system::SASystem<BPM, std::mt19937>{bpm, 1};
   
   sa_system.SetSample({+1, +1, +1});
   EXPECT_EQ(sa_system.GetSystemSize(), 3);
   EXPECT_EQ(sa_system.ExtractSample().size(), 3);
   EXPECT_EQ(sa_system.ExtractSample().at(0), 1);
   EXPECT_EQ(sa_system.ExtractSample().at(1), 1);
   EXPECT_EQ(sa_system.ExtractSample().at(2), 1);
   EXPECT_EQ(sa_system.GetBaseEnergyDifference().size(), 3);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(0), -3.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(1), -3.5);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(2), -0.5);
   sa_system.Flip(0);
   EXPECT_EQ(sa_system.GetBaseEnergyDifference().size(), 3);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(0), +3.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(1), -0.5);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(2), -1.5);
   sa_system.Flip(0);
   EXPECT_EQ(sa_system.GetBaseEnergyDifference().size(), 3);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(0), -3.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(1), -3.5);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(2), -0.5);
   sa_system.Flip(1);
   EXPECT_EQ(sa_system.GetBaseEnergyDifference().size(), 3);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(0), +0.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(1), +3.5);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(2), -2.0);
   sa_system.Flip(1);
   EXPECT_EQ(sa_system.GetBaseEnergyDifference().size(), 3);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(0), -3.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(1), -3.5);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(2), -0.5);
   sa_system.Flip(2);
   EXPECT_EQ(sa_system.GetBaseEnergyDifference().size(), 3);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(0), -4.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(1), -5.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(2), +0.5);
   sa_system.Flip(2);
   EXPECT_EQ(sa_system.GetBaseEnergyDifference().size(), 3);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(0), -3.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(1), -3.5);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(2), -0.5);
}